

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hooking.cpp
# Opt level: O0

void __thiscall
ChickenHook::trampoline_receiver(ChickenHook *this,int param_1,siginfo_t *si,void *arg)

{
  ulong uVar1;
  bool bVar2;
  reference pTVar3;
  void *pvVar4;
  void *pvVar5;
  undefined4 in_register_00000034;
  undefined4 *puVar6;
  double in_XMM0_Qa;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  _func_void *hookFun;
  void *hook;
  undefined1 local_d0 [8];
  Trampoline trampoline;
  iterator __end1;
  iterator __begin1;
  vector<ChickenHook::Trampoline,_std::allocator<ChickenHook::Trampoline>_> *__range1;
  ucontext_t *p;
  void *arg_local;
  siginfo_t *si_local;
  int param_0_local;
  
  puVar6 = (undefined4 *)CONCAT44(in_register_00000034,param_1);
  log(in_XMM0_Qa);
  bVar2 = std::vector<ChickenHook::Trampoline,_std::allocator<ChickenHook::Trampoline>_>::empty
                    ((vector<ChickenHook::Trampoline,_std::allocator<ChickenHook::Trampoline>_> *)
                     trampolines);
  if (bVar2) {
    log(__x);
  }
  __end1 = std::vector<ChickenHook::Trampoline,_std::allocator<ChickenHook::Trampoline>_>::begin
                     ((vector<ChickenHook::Trampoline,_std::allocator<ChickenHook::Trampoline>_> *)
                      trampolines);
  trampoline._136_8_ =
       std::vector<ChickenHook::Trampoline,_std::allocator<ChickenHook::Trampoline>_>::end
                 ((vector<ChickenHook::Trampoline,_std::allocator<ChickenHook::Trampoline>_> *)
                  trampolines);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<ChickenHook::Trampoline_*,_std::vector<ChickenHook::Trampoline,_std::allocator<ChickenHook::Trampoline>_>_>
                                     *)&trampoline.infoAvailable), bVar2) {
    pTVar3 = __gnu_cxx::
             __normal_iterator<ChickenHook::Trampoline_*,_std::vector<ChickenHook::Trampoline,_std::allocator<ChickenHook::Trampoline>_>_>
             ::operator*(&__end1);
    Trampoline::Trampoline((Trampoline *)local_d0,pTVar3);
    pvVar5 = *(void **)(puVar6 + 4);
    pvVar4 = Trampoline::getOriginal((Trampoline *)local_d0);
    if ((pvVar4 <= pvVar5) &&
       (uVar1 = *(ulong *)(puVar6 + 4), pvVar5 = Trampoline::getOriginal((Trampoline *)local_d0),
       uVar1 <= (long)pvVar5 + 0x40U)) {
      log(__x_01);
      pvVar5 = Trampoline::getHook((Trampoline *)local_d0);
      log(__x_02);
      si[1]._sifields._sigchld.si_stime = (__clock_t)pvVar5;
      *puVar6 = 0x12;
    }
    Trampoline::~Trampoline((Trampoline *)local_d0);
    __gnu_cxx::
    __normal_iterator<ChickenHook::Trampoline_*,_std::vector<ChickenHook::Trampoline,_std::allocator<ChickenHook::Trampoline>_>_>
    ::operator++(&__end1);
  }
  log(__x_00);
  return;
}

Assistant:

static void trampoline_receiver(int, siginfo_t *si, void *arg) {
        log("Caught segfault at address <%p>", si->si_addr);

        auto *p = (ucontext_t *) arg;
        if (trampolines.empty()) {
            log("Warning!! trampoline size is 0");
        }

        // search the corresponding trampoline
        for (auto trampoline : trampolines) {
            if (si->si_addr >= trampoline.getOriginal() &&
                si->si_addr <= ((uint8_t *) trampoline.getOriginal()) + CODE_SIZE) {
                log("Found hook <%p>", si->si_addr);
                void *hook = trampoline.getHook();
                auto hookFun = (void (*)()) hook;
                log("Overwrite pc");
                // now set the pc to our hook function
#if defined(__APPLE__) && (__x86_64__)
                p->uc_mcontext->__ss.__rip = reinterpret_cast<register_t>(hookFun);
#elif defined(__APPLE__) && (__i386__)
                p->uc_mcontext->__ss.__eip = reinterpret_cast<register_t>(hookFun);
#else
#ifdef __i386__
                p->uc_mcontext.gregs[REG_EIP] = reinterpret_cast<greg_t>(hookFun);
#elif __aarch64__
                p->uc_mcontext.pc = reinterpret_cast<greg_t>(hookFun);
#elif __x86_64__
                p->uc_mcontext.gregs[REG_RIP] = reinterpret_cast<greg_t>(hookFun);
#else
#error "UNSUPPORTED"
#endif
#endif
                si->si_signo = SIGCONT;
            }

        }
        log("Continue execution");
    }